

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmatrix.cpp
# Opt level: O3

void __thiscall
TPZMatrix<long_double>::AddKel
          (TPZMatrix<long_double> *this,TPZFMatrix<long_double> *elmat,TPZVec<long> *source,
          TPZVec<long> *destinationindex)

{
  long lVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  longdouble lVar5;
  longdouble lVar6;
  longdouble lVar7;
  longdouble lVar8;
  longdouble lVar9;
  int iVar10;
  long lVar11;
  long lVar12;
  bool bVar13;
  longdouble in_ST0;
  longdouble lVar14;
  longdouble in_ST1;
  longdouble in_ST2;
  longdouble in_ST3;
  longdouble in_ST4;
  longdouble in_ST5;
  longdouble in_ST6;
  longdouble local_78;
  long local_68;
  long local_60;
  long local_58;
  long local_50;
  long local_48;
  long local_40;
  TPZMatrix<long_double> *local_38;
  
  lVar11 = source->fNElements;
  iVar10 = (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x10])();
  local_48 = lVar11;
  if (iVar10 == 0) {
    if (0 < lVar11) {
      local_40 = 0;
      do {
        lVar11 = destinationindex->fStore[local_40];
        local_60 = source->fStore[local_40];
        local_68 = local_60 << 4;
        lVar12 = 0;
        lVar14 = in_ST0;
        lVar5 = in_ST1;
        lVar6 = in_ST2;
        lVar7 = in_ST3;
        lVar8 = in_ST4;
        lVar9 = in_ST5;
        local_58 = lVar11;
        do {
          in_ST5 = in_ST6;
          in_ST4 = lVar9;
          in_ST3 = lVar8;
          in_ST2 = lVar7;
          in_ST1 = lVar6;
          in_ST0 = lVar5;
          lVar3 = local_60;
          bVar13 = local_60 < 0;
          local_50 = destinationindex->fStore[lVar12];
          lVar1 = source->fStore[lVar12];
          (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])(this,lVar11);
          lVar11 = local_58;
          lVar2 = (elmat->super_TPZMatrix<long_double>).super_TPZBaseMatrix.fRow;
          if (((lVar2 <= lVar3 || bVar13) || (lVar1 < 0)) ||
             ((elmat->super_TPZMatrix<long_double>).super_TPZBaseMatrix.fCol <= lVar1)) {
            TPZFMatrix<long_double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
            pzinternal::DebugStopImpl
                      ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                       ,0x26d);
          }
          local_78 = *(longdouble *)((long)elmat->fElem + local_68 + lVar2 * lVar1 * 0x10) + lVar14;
          in_ST6 = in_ST5;
          (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x23])
                    (this,local_58,local_50,&local_78);
          lVar12 = lVar12 + 1;
          lVar14 = in_ST0;
          lVar5 = in_ST1;
          lVar6 = in_ST2;
          lVar7 = in_ST3;
          lVar8 = in_ST4;
          lVar9 = in_ST5;
        } while (local_48 != lVar12);
        local_40 = local_40 + 1;
      } while (local_40 != local_48);
    }
  }
  else if (0 < lVar11) {
    lVar11 = 0;
    local_38 = this;
    do {
      lVar12 = destinationindex->fStore[lVar11];
      local_58 = source->fStore[lVar11];
      local_60 = local_58 << 4;
      lVar14 = in_ST0;
      lVar5 = in_ST1;
      lVar6 = in_ST2;
      lVar7 = in_ST3;
      lVar8 = in_ST4;
      lVar9 = in_ST5;
      local_68 = lVar11;
      local_50 = lVar12;
      do {
        in_ST5 = in_ST6;
        in_ST4 = lVar9;
        in_ST3 = lVar8;
        in_ST2 = lVar7;
        in_ST1 = lVar6;
        in_ST0 = lVar5;
        lVar4 = local_58;
        bVar13 = local_58 < 0;
        lVar1 = destinationindex->fStore[lVar11];
        lVar2 = source->fStore[lVar11];
        (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])(this,lVar12,lVar1);
        this = local_38;
        lVar12 = local_50;
        lVar3 = (elmat->super_TPZMatrix<long_double>).super_TPZBaseMatrix.fRow;
        if (((lVar3 <= lVar4 || bVar13) || (lVar2 < 0)) ||
           ((elmat->super_TPZMatrix<long_double>).super_TPZBaseMatrix.fCol <= lVar2)) {
          TPZFMatrix<long_double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
          pzinternal::DebugStopImpl
                    ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                     ,0x26d);
        }
        local_78 = *(longdouble *)((long)elmat->fElem + local_60 + lVar3 * lVar2 * 0x10) + lVar14;
        in_ST6 = in_ST5;
        (*(local_38->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x23])
                  (local_38,local_50,lVar1,&local_78);
        lVar11 = lVar11 + 1;
        lVar14 = in_ST0;
        lVar5 = in_ST1;
        lVar6 = in_ST2;
        lVar7 = in_ST3;
        lVar8 = in_ST4;
        lVar9 = in_ST5;
      } while (lVar11 < local_48);
      lVar11 = local_68 + 1;
    } while (lVar11 != local_48);
  }
  return;
}

Assistant:

void TPZMatrix<TVar>::AddKel(TPZFMatrix<TVar> &elmat, TPZVec<int64_t> &source, TPZVec<int64_t> &destinationindex) {
	
	int64_t nelem = source.NElements();
  	int64_t icoef,jcoef,ieq,jeq,ieqs,jeqs;
    TVar prevval;
	if(IsSymmetric()) {
		for(icoef=0; icoef<nelem; icoef++) {
			ieq = destinationindex[icoef];
			ieqs = source[icoef];
			for(jcoef=icoef; jcoef<nelem; jcoef++) {
				jeq = destinationindex[jcoef];
				jeqs = source[jcoef];
				prevval = GetVal(ieq,jeq);
				prevval += elmat(ieqs,jeqs);
				PutVal(ieq,jeq,prevval);
			}
		}
	} else {
		for(icoef=0; icoef<nelem; icoef++) {
			ieq = destinationindex[icoef];
			ieqs = source[icoef];
			for(jcoef=0; jcoef<nelem; jcoef++) {
				jeq = destinationindex[jcoef];
				jeqs = source[jcoef];
				prevval = GetVal(ieq,jeq);
				prevval += elmat(ieqs,jeqs);
				PutVal(ieq,jeq,prevval);
			}
		}
	}
}